

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

Context * Rml::GetContext(String *name)

{
  bool bVar1;
  CoreData *pCVar2;
  pointer ppVar3;
  iterator local_38;
  undefined1 local_28 [8];
  iterator it;
  String *name_local;
  
  it.mInfo = (uint8_t *)name;
  pCVar2 = ControlledLifetimeResource<Rml::CoreData>::operator->
                     ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
  _local_28 = robin_hood::detail::
              Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&pCVar2->contexts,(key_type *)it.mInfo);
  pCVar2 = ControlledLifetimeResource<Rml::CoreData>::operator->
                     ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
  local_38 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&pCVar2->contexts);
  bVar1 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::Iter<false>::operator==((Iter<false> *)local_28,&local_38);
  if (bVar1) {
    name_local = (String *)0x0;
  }
  else {
    ppVar3 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Iter<false>::operator->((Iter<false> *)local_28);
    name_local = (String *)
                 ::std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>::get(&ppVar3->second)
    ;
  }
  return (Context *)name_local;
}

Assistant:

Context* GetContext(const String& name)
{
	auto it = core_data->contexts.find(name);
	if (it == core_data->contexts.end())
		return nullptr;

	return it->second.get();
}